

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pl_DCT.cc
# Opt level: O0

void skip_buffer_input_data(j_decompress_ptr cinfo,long num_bytes)

{
  runtime_error *this;
  size_t sVar1;
  size_t to_skip;
  long local_18;
  long num_bytes_local;
  j_decompress_ptr cinfo_local;
  
  local_18 = num_bytes;
  num_bytes_local = (long)cinfo;
  if (-1 < num_bytes) {
    sVar1 = QIntC::to_size<long>(&local_18);
    if ((sVar1 == 0) || (*(ulong *)(*(long *)(num_bytes_local + 0x28) + 8) < sVar1)) {
      if (sVar1 != 0) {
        **(long **)(num_bytes_local + 0x28) =
             *(long *)(*(long *)(num_bytes_local + 0x28) + 8) + **(long **)(num_bytes_local + 0x28);
        *(undefined8 *)(*(long *)(num_bytes_local + 0x28) + 8) = 0;
      }
    }
    else {
      **(long **)(num_bytes_local + 0x28) = sVar1 + **(long **)(num_bytes_local + 0x28);
      *(size_t *)(*(long *)(num_bytes_local + 0x28) + 8) =
           *(long *)(*(long *)(num_bytes_local + 0x28) + 8) - sVar1;
    }
    return;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error
            (this,"reading jpeg: jpeg library requested skipping a negative number of bytes");
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

static void
skip_buffer_input_data(j_decompress_ptr cinfo, long num_bytes)
{
    if (num_bytes < 0) {
        throw std::runtime_error(
            "reading jpeg: jpeg library requested skipping a negative number of bytes");
    }
    size_t to_skip = QIntC::to_size(num_bytes);
    if ((to_skip > 0) && (to_skip <= cinfo->src->bytes_in_buffer)) {
        cinfo->src->next_input_byte += to_skip;
        cinfo->src->bytes_in_buffer -= to_skip;
    } else if (to_skip != 0) {
        cinfo->src->next_input_byte += cinfo->src->bytes_in_buffer;
        cinfo->src->bytes_in_buffer = 0;
    }
}